

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O2

shared_ptr<pstore::repo::definition> __thiscall
pstore::database::getrw<pstore::repo::definition,void>
          (database *this,extent<pstore::repo::definition> *ex)

{
  ulong *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<pstore::repo::definition> sVar1;
  
  if ((*in_RDX & 0xf) == 0) {
    getrw((database *)&stack0xffffffffffffffe0,(address)ex,*in_RDX);
    std::static_pointer_cast<pstore::repo::definition,void>((shared_ptr<void> *)this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
    sVar1.super___shared_ptr<pstore::repo::definition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = extraout_RDX._M_pi;
    sVar1.super___shared_ptr<pstore::repo::definition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<pstore::repo::definition>)
           sVar1.super___shared_ptr<pstore::repo::definition,_(__gnu_cxx::_Lock_policy)2>;
  }
  raise<pstore::error_code>(bad_alignment);
}

Assistant:

std::shared_ptr<T> getrw (extent<T> const & ex) {
            if (ex.addr.to_address ().absolute () % alignof (T) != 0) {
                raise (error_code::bad_alignment);
            }
            // Note that ex.size specifies the size in bytes of the data to be loaded, not the
            // number of elements of type T. For this reason we call the plain address version of
            // getro().
            return std::static_pointer_cast<T> (this->getrw (ex.addr.to_address (), ex.size));
        }